

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mkvmuxer.cc
# Opt level: O0

bool mkvmuxer::anon_unknown_12::CopyChromaticity
               (PrimaryChromaticity *src,PrimaryChromaticityPtr *dst)

{
  PrimaryChromaticity *this;
  float x_val;
  float y_val;
  pointer local_48;
  PrimaryChromaticityPtr *dst_local;
  PrimaryChromaticity *src_local;
  
  if (dst == (PrimaryChromaticityPtr *)0x0) {
    src_local._7_1_ = false;
  }
  else {
    this = (PrimaryChromaticity *)operator_new(8,(nothrow_t *)&std::nothrow);
    local_48 = (pointer)0x0;
    if (this != (PrimaryChromaticity *)0x0) {
      x_val = PrimaryChromaticity::x(src);
      y_val = PrimaryChromaticity::y(src);
      PrimaryChromaticity::PrimaryChromaticity(this,x_val,y_val);
      local_48 = this;
    }
    std::
    unique_ptr<mkvmuxer::PrimaryChromaticity,_std::default_delete<mkvmuxer::PrimaryChromaticity>_>::
    reset(dst,local_48);
    if (dst == (PrimaryChromaticityPtr *)0x0) {
      src_local._7_1_ = false;
    }
    else {
      src_local._7_1_ = true;
    }
  }
  return src_local._7_1_;
}

Assistant:

bool CopyChromaticity(const PrimaryChromaticity* src,
                      PrimaryChromaticityPtr* dst) {
  if (!dst)
    return false;

  dst->reset(new (std::nothrow) PrimaryChromaticity(src->x(), src->y()));
  if (!dst)
    return false;

  return true;
}